

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_window_correctOverflow(ZSTD_window_t *window,U32 cycleLog,U32 maxDist,void *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 1 << ((byte)cycleLog & 0x1f);
  uVar4 = uVar3 - 1;
  uVar1 = (int)src - (int)window->base;
  uVar2 = uVar4 & uVar1;
  if (uVar2 == 0) {
    uVar2 = uVar3;
  }
  if ((uVar4 & maxDist) != 0) {
    __assert_fail("(maxDist & cycleMask) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2195,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  uVar2 = uVar2 + maxDist;
  if (uVar1 <= uVar2) {
    __assert_fail("current > newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2196,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  uVar1 = uVar1 - uVar2;
  if (uVar1 < 0x10000001) {
    __assert_fail("correction > 1<<28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2198,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  window->base = window->base + uVar1;
  window->dictBase = window->dictBase + uVar1;
  uVar4 = window->lowLimit - uVar1;
  if (window->lowLimit < uVar1 || uVar4 == 0) {
    uVar4 = 1;
  }
  uVar3 = window->dictLimit - uVar1;
  if (window->dictLimit < uVar1 || uVar3 == 0) {
    uVar3 = 1;
  }
  window->lowLimit = uVar4;
  window->dictLimit = uVar3;
  if (uVar2 < maxDist) {
    __assert_fail("newCurrent >= maxDist",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x21a2,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar2 < uVar4) {
    __assert_fail("window->lowLimit <= newCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x21a5,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar3 <= uVar2) {
    return uVar1;
  }
  __assert_fail("window->dictLimit <= newCurrent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x21a6,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
}

Assistant:

MEM_STATIC U32 ZSTD_window_correctOverflow(ZSTD_window_t* window, U32 cycleLog,
                                           U32 maxDist, void const* src)
{
    /* preemptive overflow correction:
     * 1. correction is large enough:
     *    lowLimit > (3<<29) ==> current > 3<<29 + 1<<windowLog
     *    1<<windowLog <= newCurrent < 1<<chainLog + 1<<windowLog
     *
     *    current - newCurrent
     *    > (3<<29 + 1<<windowLog) - (1<<windowLog + 1<<chainLog)
     *    > (3<<29) - (1<<chainLog)
     *    > (3<<29) - (1<<30)             (NOTE: chainLog <= 30)
     *    > 1<<29
     *
     * 2. (ip+ZSTD_CHUNKSIZE_MAX - cctx->base) doesn't overflow:
     *    After correction, current is less than (1<<chainLog + 1<<windowLog).
     *    In 64-bit mode we are safe, because we have 64-bit ptrdiff_t.
     *    In 32-bit mode we are safe, because (chainLog <= 29), so
     *    ip+ZSTD_CHUNKSIZE_MAX - cctx->base < 1<<32.
     * 3. (cctx->lowLimit + 1<<windowLog) < 1<<32:
     *    windowLog <= 31 ==> 3<<29 + 1<<windowLog < 7<<29 < 1<<32.
     */
    U32 const cycleMask = (1U << cycleLog) - 1;
    U32 const current = (U32)((BYTE const*)src - window->base);
    U32 const currentCycle0 = current & cycleMask;
    /* Exclude zero so that newCurrent - maxDist >= 1. */
    U32 const currentCycle1 = currentCycle0 == 0 ? (1U << cycleLog) : currentCycle0;
    U32 const newCurrent = currentCycle1 + maxDist;
    U32 const correction = current - newCurrent;
    assert((maxDist & cycleMask) == 0);
    assert(current > newCurrent);
    /* Loose bound, should be around 1<<29 (see above) */
    assert(correction > 1<<28);

    window->base += correction;
    window->dictBase += correction;
    if (window->lowLimit <= correction) window->lowLimit = 1;
    else window->lowLimit -= correction;
    if (window->dictLimit <= correction) window->dictLimit = 1;
    else window->dictLimit -= correction;

    /* Ensure we can still reference the full window. */
    assert(newCurrent >= maxDist);
    assert(newCurrent - maxDist >= 1);
    /* Ensure that lowLimit and dictLimit didn't underflow. */
    assert(window->lowLimit <= newCurrent);
    assert(window->dictLimit <= newCurrent);

    DEBUGLOG(4, "Correction of 0x%x bytes to lowLimit=0x%x", correction,
             window->lowLimit);
    return correction;
}